

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>
                  *this)

{
  long lVar1;
  long lVar2;
  char16_t *pcVar3;
  char *pcVar4;
  QChar *out;
  char16_t *pcVar5;
  QLatin1StringView in;
  
  lVar1 = (this->a).a.a.d.size;
  out = (QChar *)(this->a).b.d.size;
  lVar2 = (this->a).a.b.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,(long)&out->ucs + lVar1 + lVar2 + 1,Uninitialized);
  pcVar3 = (__return_storage_ptr__->d).ptr;
  lVar1 = (this->a).a.a.d.size;
  if (lVar1 != 0) {
    pcVar5 = (this->a).a.a.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = L"";
    }
    memcpy(pcVar3,pcVar5,lVar1 * 2);
  }
  pcVar3 = pcVar3 + lVar1;
  pcVar4 = (char *)(this->a).a.b.m_size;
  in.m_size = (qsizetype)pcVar3;
  in.m_data = pcVar4;
  QAbstractConcatenable::appendLatin1To((QAbstractConcatenable *)(this->a).a.b.m_data,in,out);
  lVar1 = (this->a).b.d.size;
  if (lVar1 != 0) {
    pcVar5 = (this->a).b.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = L"";
    }
    memcpy(pcVar3 + (long)pcVar4,pcVar5,lVar1 * 2);
  }
  (pcVar3 + (long)pcVar4)[lVar1] = this->b;
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }